

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlFramebufferAttach(uint fboId,uint texId,int attachType,int texType,int mipLevel)

{
  GLenum GVar1;
  GLenum GVar2;
  
  (*glad_glBindFramebuffer)(0x8d40,fboId);
  if ((uint)attachType < 8) {
    if (texType == 200) {
      GVar2 = attachType + 0x8ce0;
LAB_00119a17:
      (*glad_glFramebufferRenderbuffer)(0x8d40,GVar2,0x8d41,texId);
      goto LAB_00119a4f;
    }
    if (texType == 100) {
      GVar2 = attachType + 0x8ce0;
      goto LAB_001199cf;
    }
    if (texType < 0) goto LAB_00119a4f;
    GVar2 = attachType + 0x8ce0;
    GVar1 = texType + 0x8515;
  }
  else {
    if (attachType == 100) {
      if (texType == 200) {
        GVar2 = 0x8d00;
        goto LAB_00119a17;
      }
      if (texType != 100) goto LAB_00119a4f;
      GVar2 = 0x8d00;
    }
    else {
      if (attachType != 200) goto LAB_00119a4f;
      if (texType == 200) {
        GVar2 = 0x8d20;
        goto LAB_00119a17;
      }
      if (texType != 100) goto LAB_00119a4f;
      GVar2 = 0x8d20;
    }
LAB_001199cf:
    GVar1 = 0xde1;
  }
  (*glad_glFramebufferTexture2D)(0x8d40,GVar2,GVar1,texId,mipLevel);
LAB_00119a4f:
  (*glad_glBindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void rlFramebufferAttach(unsigned int fboId, unsigned int texId, int attachType, int texType, int mipLevel)
{
#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(SUPPORT_RENDER_TEXTURES_HINT)
    glBindFramebuffer(GL_FRAMEBUFFER, fboId);

    switch (attachType)
    {
        case RL_ATTACHMENT_COLOR_CHANNEL0:
        case RL_ATTACHMENT_COLOR_CHANNEL1:
        case RL_ATTACHMENT_COLOR_CHANNEL2:
        case RL_ATTACHMENT_COLOR_CHANNEL3:
        case RL_ATTACHMENT_COLOR_CHANNEL4:
        case RL_ATTACHMENT_COLOR_CHANNEL5:
        case RL_ATTACHMENT_COLOR_CHANNEL6:
        case RL_ATTACHMENT_COLOR_CHANNEL7:
        {
            if (texType == RL_ATTACHMENT_TEXTURE2D) glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + attachType, GL_TEXTURE_2D, texId, mipLevel);
            else if (texType == RL_ATTACHMENT_RENDERBUFFER) glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + attachType, GL_RENDERBUFFER, texId);
            else if (texType >= RL_ATTACHMENT_CUBEMAP_POSITIVE_X) glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + attachType, GL_TEXTURE_CUBE_MAP_POSITIVE_X + texType, texId, mipLevel);

        } break;
        case RL_ATTACHMENT_DEPTH:
        {
            if (texType == RL_ATTACHMENT_TEXTURE2D) glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, texId, mipLevel);
            else if (texType == RL_ATTACHMENT_RENDERBUFFER)  glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, texId);

        } break;
        case RL_ATTACHMENT_STENCIL:
        {
            if (texType == RL_ATTACHMENT_TEXTURE2D) glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, texId, mipLevel);
            else if (texType == RL_ATTACHMENT_RENDERBUFFER)  glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, texId);

        } break;
        default: break;
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
#endif
}